

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O1

bool crnlib::create_compressed_texture
               (crn_comp_params *params,crn_mipmap_params *mipmap_params,
               vector<unsigned_char> *comp_data,uint32 *pActual_quality_level,float *pActual_bitrate
               )

{
  vector<crnlib::mip_level_*> *pvVar1;
  uint min_new_capacity;
  uint uVar2;
  uint uVar3;
  crn_uint32 *pcVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  void *pvVar6;
  mip_level **ppmVar7;
  long lVar8;
  mip_level *this;
  image_u8 *p;
  ulong uVar9;
  ulong uVar10;
  crn_uint32 *(*__s) [16];
  crn_file_type cVar11;
  crn_uint32 **ppcVar12;
  ulong uVar13;
  crn_comp_params *pcVar14;
  uint uVar15;
  crn_uint32 cVar16;
  bool bVar17;
  bool bVar18;
  mipmapped_texture work_tex;
  crn_comp_params new_params;
  crn_comp_params *local_12e8;
  crn_uint32 *(*local_12e0) [16];
  face_vec local_12d8;
  ulong local_12c0;
  crn_comp_params *local_12b8;
  vector<unsigned_char> *local_12b0;
  uint32 *local_12a8;
  float *local_12a0;
  crn_mipmap_params *local_1298;
  ulong local_1290;
  crn_comp_params *local_1288;
  mipmapped_texture local_1280;
  crn_comp_params local_1238 [5];
  
  if (comp_data->m_size != 0) {
    comp_data->m_size = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  local_12b0 = comp_data;
  local_12a8 = pActual_quality_level;
  local_12a0 = pActual_bitrate;
  local_1298 = mipmap_params;
  mipmapped_texture::mipmapped_texture(&local_1280);
  lVar8 = 0x18;
  do {
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x40U + lVar8) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x48U + lVar8) = 0;
    *(undefined4 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x50U + lVar8) = 0xf;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x58U + lVar8) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x60U + lVar8) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x68U + lVar8) = 0;
    lVar8 = lVar8 + 0x30;
  } while (lVar8 != 0x1218);
  bVar17 = params->m_faces == 0;
  local_12c0 = CONCAT71((int7)((ulong)pActual_quality_level >> 8),bVar17);
  if (bVar17) {
    uVar15 = 0;
  }
  else {
    local_12e0 = params->m_pImages;
    pcVar14 = local_1238;
    uVar10 = 0;
    local_12c0 = 0;
    bVar17 = false;
    local_12b8 = params;
    do {
      bVar18 = params->m_levels != 0;
      local_1290 = uVar10;
      local_1288 = pcVar14;
      if (bVar18) {
        uVar10 = 0;
        do {
          uVar15 = params->m_width >> ((byte)uVar10 & 0x1f);
          cVar16 = uVar15 + (uVar15 == 0);
          uVar15 = params->m_height >> ((byte)uVar10 & 0x1f);
          cVar11 = uVar15 + (uVar15 == 0);
          pcVar4 = (*local_12e0)[uVar10];
          if (pcVar4 != (crn_uint32 *)0x0) {
            if (*(void **)&pcVar14->m_flags != (void *)0x0) {
              crnlib_free(*(void **)&pcVar14->m_flags);
              *(undefined8 *)&pcVar14->m_flags = 0;
              pcVar14->m_pImages[0][0] = (crn_uint32 *)0x0;
            }
            pcVar14->m_format = (crn_format)pcVar4;
            pcVar14->m_size_of_obj = cVar16;
            pcVar14->m_file_type = cVar11;
            pcVar14->m_faces = cVar16;
            pcVar14->m_width = cVar11 * cVar16;
            pcVar14->m_height = 0xf;
            if (bVar17 == false) {
              bVar17 = image_utils::has_alpha((image_u8 *)pcVar14);
            }
          }
          params = local_12b8;
          if (pcVar4 == (crn_uint32 *)0x0) break;
          uVar10 = uVar10 + 1;
          pcVar14 = (crn_comp_params *)((long)pcVar14->m_pImages[0] + 8);
          bVar18 = uVar10 < local_12b8->m_levels;
        } while (bVar18);
      }
      if (bVar18) break;
      uVar10 = local_1290 + 1;
      local_12e0 = local_12e0 + 1;
      pcVar14 = (crn_comp_params *)((long)(local_1288->m_pImages + 5) + 0x58);
      bVar18 = uVar10 < params->m_faces;
      local_12c0 = CONCAT71((int7)(local_12c0 >> 8),!bVar18);
    } while (bVar18);
    uVar15 = (uint)bVar17 << 3;
  }
  if ((local_12c0 & 1) != 0) {
    min_new_capacity = params->m_faces;
    if ((ulong)min_new_capacity != 0) {
      uVar2 = params->m_levels;
      ppcVar12 = (crn_uint32 **)&local_1238[0].m_height;
      uVar10 = 0;
      do {
        if (uVar2 != 0) {
          lVar8 = 0;
          do {
            *(uint *)((long)ppcVar12 + lVar8) =
                 *(uint *)((long)ppcVar12 + lVar8) & 0xfffffff7 | uVar15;
            lVar8 = lVar8 + 0x30;
          } while ((ulong)uVar2 * 0x30 != lVar8);
        }
        uVar10 = uVar10 + 1;
        ppcVar12 = ppcVar12 + 0x60;
      } while (uVar10 != min_new_capacity);
    }
    local_12d8.m_p = (vector<crnlib::mip_level_*> *)0x0;
    local_12d8.m_size = 0;
    local_12d8.m_capacity = 0;
    if (min_new_capacity != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_12d8,min_new_capacity,min_new_capacity == 1,0x10,
                 (object_mover)0x0,false);
      if (min_new_capacity != local_12d8.m_size) {
        memset(local_12d8.m_p + (local_12d8._8_8_ & 0xffffffff),0,
               (ulong)(min_new_capacity - local_12d8.m_size) << 4);
      }
      local_12d8.m_size = min_new_capacity;
    }
    if (params->m_faces != 0) {
      local_12e8 = local_1238;
      local_12e0 = (crn_uint32 *(*) [16])0x0;
      do {
        if (params->m_levels != 0) {
          uVar10 = 0;
          pcVar14 = local_12e8;
          do {
            this = (mip_level *)crnlib_malloc(0x28);
            mip_level::mip_level(this);
            p = (image_u8 *)crnlib_malloc(0x30);
            p->m_width = 0;
            p->m_height = 0;
            p->m_pitch = 0;
            p->m_total = 0;
            p->m_comp_flags = 0xf;
            p->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            (p->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
            (p->m_pixel_buf).m_size = 0;
            (p->m_pixel_buf).m_capacity = 0;
            p->m_width = pcVar14->m_size_of_obj;
            pcVar14->m_size_of_obj = 0;
            cVar11 = p->m_height;
            p->m_height = pcVar14->m_file_type;
            pcVar14->m_file_type = cVar11;
            uVar3 = p->m_pitch;
            p->m_pitch = pcVar14->m_faces;
            pcVar14->m_faces = uVar3;
            uVar3 = p->m_total;
            p->m_total = pcVar14->m_width;
            pcVar14->m_width = uVar3;
            uVar3 = p->m_comp_flags;
            p->m_comp_flags = pcVar14->m_height;
            pcVar14->m_height = uVar3;
            pcVar5 = p->m_pPixels;
            p->m_pPixels = (color_quad<unsigned_char,_int> *)pcVar14->m_format;
            pcVar14->m_format = (crn_format)pcVar5;
            pcVar5 = (p->m_pixel_buf).m_p;
            (p->m_pixel_buf).m_p = *(color_quad<unsigned_char,_int> **)&pcVar14->m_flags;
            *(color_quad<unsigned_char,_int> **)&pcVar14->m_flags = pcVar5;
            uVar3 = (p->m_pixel_buf).m_size;
            (p->m_pixel_buf).m_size = *(uint *)pcVar14->m_pImages[0];
            *(uint *)pcVar14->m_pImages[0] = uVar3;
            uVar3 = (p->m_pixel_buf).m_capacity;
            (p->m_pixel_buf).m_capacity = *(uint *)((long)pcVar14->m_pImages[0] + 4);
            *(uint *)((long)pcVar14->m_pImages[0] + 4) = uVar3;
            mip_level::assign(this,p,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
            pvVar1 = local_12d8.m_p + (long)local_12e0;
            if (local_12d8.m_p[(long)local_12e0].m_capacity <=
                local_12d8.m_p[(long)local_12e0].m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar1,local_12d8.m_p[(long)local_12e0].m_size + 1,true
                         ,8,(object_mover)0x0,false);
            }
            pvVar1->m_p[pvVar1->m_size] = this;
            pvVar1->m_size = pvVar1->m_size + 1;
            uVar10 = uVar10 + 1;
            pcVar14 = (crn_comp_params *)((long)pcVar14->m_pImages[0] + 8);
          } while (uVar10 < params->m_levels);
        }
        local_12e0 = (crn_uint32 *(*) [16])((long)local_12e0 + 1);
        local_12e8 = (crn_comp_params *)((long)(local_12e8->m_pImages + 5) + 0x58);
      } while (local_12e0 < (ulong)params->m_faces);
    }
    mipmapped_texture::assign(&local_1280,&local_12d8);
    pvVar1 = local_12d8.m_p;
    if (local_12d8.m_p != (vector<crnlib::mip_level_*> *)0x0) {
      uVar10 = local_12d8._8_8_ & 0xffffffff;
      if (uVar10 != 0) {
        lVar8 = 0;
        do {
          pvVar6 = *(void **)((long)&pvVar1->m_p + lVar8);
          if (pvVar6 != (void *)0x0) {
            crnlib_free(pvVar6);
          }
          lVar8 = lVar8 + 0x10;
        } while (uVar10 << 4 != lVar8);
      }
      crnlib_free(local_12d8.m_p);
    }
  }
  lVar8 = 0x1200;
  do {
    pvVar6 = *(void **)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x48U + lVar8);
    if (pvVar6 != (void *)0x0) {
      crnlib_free(pvVar6);
    }
    lVar8 = lVar8 + -0x30;
  } while (lVar8 != 0);
  if ((local_12c0 & 1) == 0) {
    uVar15 = 0;
    console::error("Failed creating DDS texture from crn_comp_params!");
  }
  else {
    bVar17 = create_texture_mipmaps(&local_1280,params,local_1298,true);
    uVar15 = 0;
    if (bVar17) {
      memcpy(local_1238,params,0x378);
      uVar10 = (ulong)local_1280.m_faces.m_size;
      if (uVar10 != 0) {
        uVar15 = (local_1280.m_faces.m_p)->m_size;
      }
      __s = local_1238[0].m_pImages;
      local_1238[0].m_levels = uVar15;
      memset(__s,0,0x300);
      if (uVar10 != 0) {
        uVar15 = (local_1280.m_faces.m_p)->m_size;
        uVar9 = 0;
        do {
          if ((ulong)uVar15 != 0) {
            ppmVar7 = local_1280.m_faces.m_p[uVar9].m_p;
            uVar13 = 0;
            do {
              (*__s)[uVar13] = (crn_uint32 *)ppmVar7[uVar13]->m_pImage->m_pPixels;
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
          }
          uVar9 = uVar9 + 1;
          __s = __s + 1;
        } while (uVar9 != uVar10);
      }
      bVar17 = create_compressed_texture(local_1238,local_12b0,local_12a8,local_12a0);
      uVar15 = (uint)bVar17;
    }
  }
  mipmapped_texture::~mipmapped_texture(&local_1280);
  return SUB41(uVar15,0);
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, const crn_mipmap_params& mipmap_params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate) {
  comp_data.resize(0);
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;
  if (pActual_quality_level)
    *pActual_quality_level = 0;

  mipmapped_texture work_tex;
  if (!create_dds_tex(params, work_tex)) {
    console::error("Failed creating DDS texture from crn_comp_params!");
    return false;
  }

  if (!create_texture_mipmaps(work_tex, params, mipmap_params, true))
    return false;

  crn_comp_params new_params(params);
  new_params.m_levels = work_tex.get_num_levels();
  memset(new_params.m_pImages, 0, sizeof(new_params.m_pImages));

  for (uint f = 0; f < work_tex.get_num_faces(); f++)
    for (uint l = 0; l < work_tex.get_num_levels(); l++)
      new_params.m_pImages[f][l] = (uint32*)work_tex.get_level(f, l)->get_image()->get_ptr();

  return create_compressed_texture(new_params, comp_data, pActual_quality_level, pActual_bitrate);
}